

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

bool __thiscall QPDFFormFieldObjectHelper::isChecked(QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool local_73;
  undefined1 local_70 [16];
  string local_60;
  byte local_29;
  undefined1 local_28 [24];
  QPDFFormFieldObjectHelper *this_local;
  
  local_28._16_8_ = this;
  bVar3 = isCheckbox(this);
  local_29 = 0;
  bVar2 = false;
  bVar1 = false;
  local_73 = false;
  if (bVar3) {
    getValue((QPDFFormFieldObjectHelper *)local_28);
    local_29 = 1;
    bVar3 = QPDFObjectHandle::isName((QPDFObjectHandle *)local_28);
    local_73 = false;
    if (bVar3) {
      getValue((QPDFFormFieldObjectHelper *)local_70);
      bVar2 = true;
      QPDFObjectHandle::getName_abi_cxx11_((string *)(local_70 + 0x10),(QPDFObjectHandle *)local_70)
      ;
      bVar1 = true;
      local_73 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_70 + 0x10),"/Off");
    }
  }
  this_local._7_1_ = local_73;
  if (bVar1) {
    std::__cxx11::string::~string((string *)(local_70 + 0x10));
  }
  if (bVar2) {
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_70);
  }
  if ((local_29 & 1) != 0) {
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
QPDFFormFieldObjectHelper::isChecked()
{
    return isCheckbox() && getValue().isName() && (getValue().getName() != "/Off");
}